

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MultiplyBroadcastableLayerParams::~MultiplyBroadcastableLayerParams
          (MultiplyBroadcastableLayerParams *this)

{
  ~MultiplyBroadcastableLayerParams(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

MultiplyBroadcastableLayerParams::~MultiplyBroadcastableLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MultiplyBroadcastableLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}